

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

void redraw_game_windows(void)

{
  WINDOW *pWVar1;
  int iVar2;
  int iVar3;
  gamewin *pgVar4;
  
  if (basewin == (WINDOW *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = basewin->_maxy + 1;
  }
  wredrawln(basewin,0,iVar2);
  wnoutrefresh(basewin);
  pgVar4 = firstgw;
  if (ui_flags.ingame != '\0') {
    iVar3 = -1;
    iVar2 = -1;
    if (mapwin != (WINDOW *)0x0) {
      iVar2 = mapwin->_maxy + 1;
    }
    wredrawln(mapwin,0,iVar2);
    if (msgwin != (WINDOW *)0x0) {
      iVar3 = msgwin->_maxy + 1;
    }
    wredrawln(msgwin,0,iVar3);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin != (WINDOW *)0x0) {
      wredrawln(statuswin,0,statuswin->_maxy + 1);
      wnoutrefresh(statuswin);
    }
    if (sidebar != (WINDOW *)0x0) {
      draw_sidebar_divider();
      if (sidebar == (WINDOW *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = sidebar->_maxy + 1;
      }
      wredrawln(sidebar,0,iVar2);
      wnoutrefresh(sidebar);
    }
    draw_frame();
    pgVar4 = firstgw;
  }
  for (; pgVar4 != (gamewin *)0x0; pgVar4 = pgVar4->next) {
    (*pgVar4->draw)(pgVar4);
    pWVar1 = pgVar4->win;
    if (pWVar1 == (WINDOW *)0x0) {
      iVar2 = -1;
    }
    else {
      iVar2 = pWVar1->_maxy + 1;
    }
    wredrawln(pWVar1,0,iVar2);
    wnoutrefresh(pgVar4->win);
  }
  return;
}

Assistant:

void redraw_game_windows(void)
{
    struct gamewin *gw;
    
    redrawwin(basewin);
    wnoutrefresh(basewin);
    
    if (ui_flags.ingame) {
	redrawwin(mapwin);
	redrawwin(msgwin);
	
	wnoutrefresh(mapwin);
	wnoutrefresh(msgwin);
	
	/* statuswin can become NULL if the terminal is resized to microscopic dimensions */
	if (statuswin) {
	    redrawwin(statuswin);
	    wnoutrefresh(statuswin);
	}
	
	if (sidebar) {
	    draw_sidebar_divider();
	    redrawwin(sidebar);
	    wnoutrefresh(sidebar);
	}
	
	draw_frame();
    }
    
    for (gw = firstgw; gw; gw = gw->next) {
	gw->draw(gw);
	redrawwin(gw->win);
	wnoutrefresh(gw->win);
    }
}